

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O0

void __thiscall tvm::runtime::GraphRuntime::SetupStorage(GraphRuntime *this)

{
  unsigned_long uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar5;
  uint *puVar6;
  reference pvVar7;
  DLDeviceType *pDVar8;
  reference pvVar9;
  reference plVar10;
  reference pvVar11;
  ostringstream *poVar12;
  ostream *poVar13;
  reference pvVar14;
  unsigned_long *puVar15;
  iterator __first;
  iterator __last;
  reference pvVar16;
  vector<long,_std::allocator<long>_> *shape_00;
  reference this_01;
  reference local_8d8;
  vector<long,_std::allocator<long>_> local_818;
  NDArray local_800;
  LogMessageFatal local_7f8;
  size_type local_670;
  unsigned_long local_668;
  LogCheckError local_660;
  LogCheckError _check_err_1;
  ulong uStack_650;
  int storage_id_1;
  size_t i_1;
  vector<long,_std::allocator<long>_> local_638;
  NDArray local_620;
  long local_618;
  __normal_iterator<DLContext_*,_std::vector<DLContext,_std::allocator<DLContext>_>_> local_610;
  value_type local_608;
  TVMContext ctx;
  __normal_iterator<DLContext_*,_std::vector<DLContext,_std::allocator<DLContext>_>_> local_5e8;
  __normal_iterator<DLContext_*,_std::vector<DLContext,_std::allocator<DLContext>_>_> *local_5e0;
  __normal_iterator<DLContext_*,_std::vector<DLContext,_std::allocator<DLContext>_>_> *cit;
  vector<long,_std::allocator<long>_> shape;
  PoolEntry *pit;
  iterator __end2_1;
  iterator __begin2_1;
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  *__range2_1;
  PoolEntry local_418;
  uint local_404;
  unsigned_long uStack_400;
  uint32_t sid;
  size_t bytes;
  ulong local_270;
  size_t bits;
  undefined1 local_260 [4];
  DLDataType t;
  LogCheckError local_d8;
  LogCheckError _check_err;
  int64_t sz;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  size_t size;
  int device_type;
  int storage_id;
  size_t i;
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  pool_entry;
  string local_70;
  TVMType local_4c;
  reference local_48;
  string *s_type;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<DLDataType,_std::allocator<DLDataType>_> vtype;
  GraphRuntime *this_local;
  
  vtype.super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<DLDataType,_std::allocator<DLDataType>_>::vector
            ((vector<DLDataType,_std::allocator<DLDataType>_> *)&__range2);
  this_00 = &(this->attrs_).dltype;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  s_type = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&s_type), bVar2) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    std::__cxx11::string::string((string *)&local_70,(string *)local_48);
    local_4c = String2TVMType(&local_70);
    std::vector<DLDataType,_std::allocator<DLDataType>_>::push_back
              ((vector<DLDataType,_std::allocator<DLDataType>_> *)&__range2,(value_type *)&local_4c)
    ;
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ::vector((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
            *)&i);
  for (_device_type = 0;
      sVar5 = std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::size(&(this->attrs_).shape), _device_type < sVar5; _device_type = _device_type + 1)
  {
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&(this->attrs_).storage_id,_device_type);
    uVar3 = *puVar6;
    pvVar7 = std::vector<DLContext,_std::allocator<DLContext>_>::operator[](&this->ctxs_,0);
    size._0_4_ = pvVar7->device_type;
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(&(this->attrs_).device_index);
    if (!bVar2) {
      pDVar8 = (DLDeviceType *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&(this->attrs_).device_index,_device_type);
      size._0_4_ = *pDVar8;
    }
    __range3 = (value_type *)0x1;
    pvVar9 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->attrs_).shape,_device_type);
    __end3 = std::vector<long,_std::allocator<long>_>::begin(pvVar9);
    sz = (int64_t)std::vector<long,_std::allocator<long>_>::end(pvVar9);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&sz), bVar2) {
      plVar10 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator*(&__end3);
      _check_err.str = (string *)*plVar10;
      __range3 = (value_type *)((long)_check_err.str * (long)__range3);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end3);
    }
    dmlc::LogCheck_GE((dmlc *)&local_d8,uVar3,0);
    bVar2 = dmlc::LogCheckError::operator_cast_to_bool(&local_d8);
    if (bVar2) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_260,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0x100);
      poVar12 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)local_260);
      poVar13 = std::operator<<((ostream *)poVar12,"Check failed: ");
      poVar13 = std::operator<<(poVar13,"storage_id >= 0");
      poVar13 = std::operator<<(poVar13,(string *)local_d8.str);
      poVar13 = std::operator<<(poVar13,": ");
      std::operator<<(poVar13,"Do not support runtime shape op");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_260);
    }
    dmlc::LogCheckError::~LogCheckError(&local_d8);
    pvVar11 = std::vector<DLDataType,_std::allocator<DLDataType>_>::operator[]
                        ((vector<DLDataType,_std::allocator<DLDataType>_> *)&__range2,_device_type);
    bits._4_4_ = *pvVar11;
    local_270 = (ulong)(int)(((uint)bits._4_4_ >> 8 & 0xff) * ((uint)bits._4_4_ >> 0x10));
    if (((local_270 & 7) != 0) && (local_270 != 1)) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&bytes,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0x103);
      poVar12 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&bytes);
      poVar13 = std::operator<<((ostream *)poVar12,"Check failed: bits % 8U == 0U || bits == 1U");
      std::operator<<(poVar13,": ");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&bytes);
    }
    uStack_400 = (local_270 + 7 >> 3) * (long)__range3;
    local_404 = uVar3;
    sVar5 = std::
            vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
            ::size((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                    *)&i);
    if (uVar3 < sVar5) {
      pvVar14 = std::
                vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                ::operator[]((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                              *)&i,(ulong)local_404);
      if ((pvVar14->device_type != -1) &&
         (pvVar14 = std::
                    vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                    ::operator[]((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                                  *)&i,(ulong)local_404), pvVar14->device_type != (DLDeviceType)size
         )) {
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&__range2_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0x10b);
        poVar12 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&__range2_1);
        poVar13 = std::operator<<((ostream *)poVar12,
                                  "Check failed: pool_entry[sid].device_type == -1 || pool_entry[sid].device_type == device_type"
                                 );
        poVar13 = std::operator<<(poVar13,": ");
        std::operator<<(poVar13,"The same pool entry cannot be assigned to multiple devices");
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&__range2_1);
      }
    }
    else {
      uVar3 = local_404 + 1;
      PoolEntry::PoolEntry(&local_418,0,-1);
      std::
      vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
      ::resize((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                *)&i,(ulong)uVar3,&local_418);
    }
    pvVar14 = std::
              vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
              ::operator[]((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                            *)&i,(ulong)local_404);
    puVar15 = std::max<unsigned_long>(&pvVar14->size,&stack0xfffffffffffffc00);
    uVar1 = *puVar15;
    pvVar14 = std::
              vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
              ::operator[]((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                            *)&i,(ulong)local_404);
    pvVar14->size = uVar1;
    pvVar14 = std::
              vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
              ::operator[]((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                            *)&i,(ulong)local_404);
    pvVar14->device_type = (DLDeviceType)size;
  }
  __end2_1 = std::
             vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
             ::begin((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
                      *)&i);
  pit = (PoolEntry *)
        std::
        vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
        ::end((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
               *)&i);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<tvm::runtime::GraphRuntime::PoolEntry_*,_std::vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>_>
                             *)&pit), bVar2) {
    shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<tvm::runtime::GraphRuntime::PoolEntry_*,_std::vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>_>
                  ::operator*(&__end2_1);
    std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&cit);
    __first = std::vector<DLContext,_std::allocator<DLContext>_>::begin(&this->ctxs_);
    __last = std::vector<DLContext,_std::allocator<DLContext>_>::end(&this->ctxs_);
    ctx = (TVMContext)
          shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    local_5e8 = std::
                find_if<__gnu_cxx::__normal_iterator<DLContext*,std::vector<DLContext,std::allocator<DLContext>>>,tvm::runtime::GraphRuntime::SetupStorage()::__0>
                          (__first._M_current,__last._M_current,
                           (anon_class_8_1_ba1d6cfb_for__M_pred)
                           shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    local_5e0 = &local_5e8;
    local_610._M_current =
         (anon_struct_8_2_68649fa6 *)
         std::vector<DLContext,_std::allocator<DLContext>_>::end(&this->ctxs_);
    bVar2 = __gnu_cxx::operator==(&local_5e8,&local_610);
    if (bVar2) {
      local_8d8 = std::vector<DLContext,_std::allocator<DLContext>_>::operator[](&this->ctxs_,0);
    }
    else {
      local_8d8 = __gnu_cxx::
                  __normal_iterator<DLContext_*,_std::vector<DLContext,_std::allocator<DLContext>_>_>
                  ::operator*(local_5e0);
    }
    local_608 = *local_8d8;
    local_618 = *shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 3;
    if (local_618 < 0) {
      local_618 = *shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 6;
    }
    local_618 = local_618 >> 2;
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&cit,&local_618);
    std::vector<long,_std::allocator<long>_>::vector
              (&local_638,(vector<long,_std::allocator<long>_> *)&cit);
    NDArray::Empty(&local_620,&local_638,(DLDataType)0x12002,(DLContext)local_608);
    std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::push_back
              (&this->storage_pool_,&local_620);
    NDArray::~NDArray(&local_620);
    std::vector<long,_std::allocator<long>_>::~vector(&local_638);
    std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)&cit);
    __gnu_cxx::
    __normal_iterator<tvm::runtime::GraphRuntime::PoolEntry_*,_std::vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>_>
    ::operator++(&__end2_1);
  }
  uVar4 = num_node_entries(this);
  std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::resize
            (&this->data_entry_,(ulong)uVar4);
  for (uStack_650 = 0;
      sVar5 = std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::size
                        (&this->data_entry_), uStack_650 < sVar5; uStack_650 = uStack_650 + 1) {
    pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&(this->attrs_).storage_id,uStack_650);
    _check_err_1.str._4_4_ = *pvVar16;
    local_668 = (unsigned_long)_check_err_1.str._4_4_;
    local_670 = std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::size
                          (&this->storage_pool_);
    dmlc::LogCheck_LT<unsigned_long,unsigned_long>((dmlc *)&local_660,&local_668,&local_670);
    bVar2 = dmlc::LogCheckError::operator_cast_to_bool(&local_660);
    if (bVar2) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_7f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0x127);
      poVar12 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_7f8);
      poVar13 = std::operator<<((ostream *)poVar12,"Check failed: ");
      poVar13 = std::operator<<(poVar13,"static_cast<size_t>(storage_id) < storage_pool_.size()");
      poVar13 = std::operator<<(poVar13,(string *)local_660.str);
      std::operator<<(poVar13,": ");
      dmlc::LogMessageFatal::~LogMessageFatal(&local_7f8);
    }
    dmlc::LogCheckError::~LogCheckError(&local_660);
    shape_00 = (vector<long,_std::allocator<long>_> *)
               std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::
               operator[](&this->storage_pool_,(long)_check_err_1.str._4_4_);
    pvVar9 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->attrs_).shape,uStack_650);
    std::vector<long,_std::allocator<long>_>::vector(&local_818,pvVar9);
    std::vector<DLDataType,_std::allocator<DLDataType>_>::operator[]
              ((vector<DLDataType,_std::allocator<DLDataType>_> *)&__range2,uStack_650);
    NDArray::CreateView(&local_800,shape_00,SUB84(&local_818,0));
    this_01 = std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::operator[]
                        (&this->data_entry_,uStack_650);
    NDArray::operator=(this_01,&local_800);
    NDArray::~NDArray(&local_800);
    std::vector<long,_std::allocator<long>_>::~vector(&local_818);
  }
  std::
  vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
  ::~vector((vector<tvm::runtime::GraphRuntime::PoolEntry,_std::allocator<tvm::runtime::GraphRuntime::PoolEntry>_>
             *)&i);
  std::vector<DLDataType,_std::allocator<DLDataType>_>::~vector
            ((vector<DLDataType,_std::allocator<DLDataType>_> *)&__range2);
  return;
}

Assistant:

void GraphRuntime::SetupStorage() {
  // Grab saved optimization plan from graph.
  std::vector<TVMType> vtype;
  for (const std::string &s_type : attrs_.dltype) {
    vtype.push_back(tvm::runtime::String2TVMType(s_type));
  }

  // Size and device type of each storage pool entry.
  std::vector<PoolEntry> pool_entry;
  // Find the maximum space size.
  for (size_t i = 0; i < attrs_.shape.size(); ++i) {
    int storage_id = attrs_.storage_id[i];
    // Use the fallback device if no device index is available.
    int device_type = static_cast<int>(ctxs_[0].device_type);
    if (!attrs_.device_index.empty()) {
      device_type = attrs_.device_index[i];
    }
    size_t size = 1;
    for (int64_t sz : attrs_.shape[i]) {
      size *= static_cast<size_t>(sz);
    }
    CHECK_GE(storage_id, 0) << "Do not support runtime shape op";
    DLDataType t = vtype[i];
    size_t bits = t.bits * t.lanes;
    CHECK(bits % 8U == 0U || bits == 1U);
    size_t bytes = ((bits + 7U) / 8U) * size;

    uint32_t sid = static_cast<uint32_t>(storage_id);
    if (sid >= pool_entry.size()) {
      pool_entry.resize(sid + 1, {0, -1});
    } else {
      CHECK(pool_entry[sid].device_type == -1 ||
            pool_entry[sid].device_type == device_type)
          << "The same pool entry cannot be assigned to multiple devices";
    }
    pool_entry[sid].size = std::max(pool_entry[sid].size, bytes);
    pool_entry[sid].device_type = device_type;
  }

  // Allocate the space.
  for (const auto &pit : pool_entry) {
    std::vector<int64_t> shape;
    // This for loop is very fast since there are usually only a couple of
    // devices available on the same hardware.
    const auto &cit =
        std::find_if(ctxs_.begin(), ctxs_.end(), [&pit](const TVMContext &c) {
          return pit.device_type == static_cast<int>(c.device_type);
        });
    TVMContext ctx = cit == ctxs_.end() ? ctxs_[0] : *cit;
    shape.push_back(static_cast<int64_t>(pit.size + 3) / 4);
    storage_pool_.push_back(
        NDArray::Empty(shape, DLDataType{kDLFloat, 32, 1}, ctx));
  }

  // Assign the pooled entries. A unified memory pool is used to simplifiy
  // memory assignment for each node entry. The allocated memory on each device
  // is mapped to this pool.
  data_entry_.resize(num_node_entries());
  for (size_t i = 0; i < data_entry_.size(); ++i) {
    int storage_id = attrs_.storage_id[i];
    CHECK_LT(static_cast<size_t>(storage_id), storage_pool_.size());
    data_entry_[i] =
        storage_pool_[storage_id].CreateView(attrs_.shape[i], vtype[i]);
  }
}